

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O1

value_type_conflict7 * __thiscall
poplar::compact_bonsai_nlm<int,_64UL>::insert
          (compact_bonsai_nlm<int,_64UL> *this,uint64_t pos,char_range *key)

{
  ulong *puVar1;
  pointer puVar2;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> tVar3;
  bool bVar4;
  unsigned_long uVar5;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var6;
  ulong pos_in_chunk;
  unsigned_long uVar7;
  unsigned_long uVar8;
  uint8_t *puVar9;
  ulong chunk_id;
  uint8_t *puVar10;
  long lVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  value_type_conflict7 *pvVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  
  chunk_id = pos >> 6;
  pos_in_chunk = (ulong)((uint)pos & 0x3f);
  lVar11 = 1;
  puVar1 = (this->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start + chunk_id;
  *puVar1 = *puVar1 | 1L << pos_in_chunk;
  this->size_ = this->size_ + 1;
  puVar2 = (this->ptrs_).
           super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((_Head_base<0UL,_unsigned_char_*,_false>)
      *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
       &puVar2[chunk_id]._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> == (uchar *)0x0)
  {
    puVar9 = (uint8_t *)0x0;
    if (key->begin != key->end) {
      puVar9 = key->end + ~(ulong)key->begin;
    }
    puVar13 = puVar9 + 4;
    lVar11 = 1;
    puVar10 = puVar13;
    if ((uint8_t *)0x7f < puVar13) {
      do {
        lVar11 = lVar11 + 1;
        bVar4 = (uint8_t *)0x3fff < puVar10;
        puVar10 = (uint8_t *)((ulong)puVar10 >> 7);
      } while (bVar4);
    }
    puVar10 = puVar9 + lVar11 + 4;
    this->label_bytes_ = (uint64_t)(puVar10 + this->label_bytes_);
    _Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__((ulong)puVar10);
    memset((void *)_Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,(size_t)puVar10);
    tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
          &puVar2[chunk_id]._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    puVar2[chunk_id]._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> =
         _Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
      operator_delete__((void *)tVar3.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
    _Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (this->ptrs_).
         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[chunk_id]._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    lVar11 = 0;
    puVar10 = puVar13;
    if ((uint8_t *)0x7f < puVar13) {
      do {
        *(byte *)((long)_Var6.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar11) =
             (byte)puVar10 | 0x80;
        lVar11 = lVar11 + 1;
        puVar13 = (uint8_t *)((ulong)puVar10 >> 7);
        bVar4 = (uint8_t *)0x3fff < puVar10;
        puVar10 = puVar13;
      } while (bVar4);
    }
    lVar11 = (long)_Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1 + lVar11;
    *(char *)(lVar11 + -1) = (char)puVar13;
    if (puVar9 != (uint8_t *)0x0) {
      puVar13 = key->begin;
      puVar10 = (uint8_t *)0x0;
      do {
        puVar10[lVar11] = puVar10[(long)puVar13];
        puVar10 = puVar10 + 1;
      } while (puVar9 != puVar10);
    }
    pvVar14 = (value_type_conflict7 *)(puVar9 + lVar11);
    puVar9 = puVar9 + lVar11;
    puVar9[0] = '\0';
    puVar9[1] = '\0';
    puVar9[2] = '\0';
    puVar9[3] = '\0';
  }
  else {
    pVar15 = get_allocs_(this,chunk_id,pos_in_chunk);
    uVar7 = pVar15.second;
    uVar5 = pVar15.first;
    puVar13 = key->begin;
    puVar9 = (uint8_t *)0x0;
    if (puVar13 != key->end) {
      puVar9 = key->end + ~(ulong)puVar13;
    }
    puVar10 = puVar9 + 4;
    if ((uint8_t *)0x7f < puVar10) {
      lVar11 = 1;
      puVar12 = puVar10;
      do {
        lVar11 = lVar11 + 1;
        bVar4 = (uint8_t *)0x3fff < puVar12;
        puVar12 = (uint8_t *)((ulong)puVar12 >> 7);
      } while (bVar4);
    }
    this->label_bytes_ = (uint64_t)(puVar9 + this->label_bytes_ + lVar11 + 4);
    __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__((ulong)(puVar9 + uVar7 + uVar5 + lVar11 + 4));
    memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,
           (size_t)(puVar9 + uVar7 + uVar5 + lVar11 + 4));
    puVar2 = (this->ptrs_).
             super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         puVar2[chunk_id]._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    if (uVar5 != 0) {
      uVar8 = 0;
      do {
        *(undefined1 *)
         ((long)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar8) =
             *(undefined1 *)
              ((long)_Var6.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar8);
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    lVar11 = 0;
    puVar12 = puVar10;
    if ((uint8_t *)0x7f < puVar10) {
      do {
        *(byte *)((long)__s.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar11 + uVar5
                 ) = (byte)puVar10 | 0x80;
        lVar11 = lVar11 + 1;
        puVar12 = (uint8_t *)((ulong)puVar10 >> 7);
        bVar4 = (uint8_t *)0x3fff < puVar10;
        puVar10 = puVar12;
      } while (bVar4);
    }
    lVar11 = (long)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar11 + uVar5 + 1;
    *(char *)(lVar11 + -1) = (char)puVar12;
    if (puVar9 != (uint8_t *)0x0) {
      puVar10 = (uint8_t *)0x0;
      do {
        puVar10[lVar11] = puVar13[(long)puVar10];
        puVar10 = puVar10 + 1;
      } while (puVar9 != puVar10);
    }
    pvVar14 = (value_type_conflict7 *)(puVar9 + lVar11);
    puVar9 = puVar9 + lVar11;
    puVar9[0] = '\0';
    puVar9[1] = '\0';
    puVar9[2] = '\0';
    puVar9[3] = '\0';
    if (uVar7 != 0) {
      uVar8 = 0;
      do {
        *(undefined1 *)((long)pvVar14 + uVar8 + 4) =
             *(undefined1 *)
              ((long)_Var6.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar5 + uVar8);
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
          &puVar2[chunk_id]._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    puVar2[chunk_id]._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> =
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
      operator_delete__((void *)tVar3.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
  }
  return pvVar14;
}

Assistant:

value_type* insert(uint64_t pos, const char_range& key) {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        assert(!bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk));
        bit_tools::set_bit(chunks_[chunk_id], pos_in_chunk);

        ++size_;

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max<uint64_t>(max_length_, key.length());
        sum_length_ += key.length();
#endif

        if (!ptrs_[chunk_id]) {
            // First association in the group
            uint64_t length = key.empty() ? 0 : key.length() - 1;
            uint64_t new_alloc = vbyte::size(length + sizeof(value_type)) + length + sizeof(value_type);
            label_bytes_ += new_alloc;

            ptrs_[chunk_id] = std::make_unique<uint8_t[]>(new_alloc);
            uint8_t* ptr = ptrs_[chunk_id].get();

            ptr += vbyte::encode(ptr, length + sizeof(value_type));
            copy_bytes(ptr, key.begin, length);

            auto ret_ptr = reinterpret_cast<value_type*>(ptr + length);
            *ret_ptr = static_cast<value_type>(0);

            return ret_ptr;
        }

        // Second and subsequent association in the group
        auto fr_alloc = get_allocs_(chunk_id, pos_in_chunk);

        const uint64_t len = key.empty() ? 0 : key.length() - 1;
        const uint64_t new_alloc = vbyte::size(len + sizeof(value_type)) + len + sizeof(value_type);
        label_bytes_ += new_alloc;

        auto new_unique = std::make_unique<uint8_t[]>(fr_alloc.first + new_alloc + fr_alloc.second);

        // Get raw pointers
        const uint8_t* orig_ptr = ptrs_[chunk_id].get();
        uint8_t* new_ptr = new_unique.get();

        // Copy the front allocation
        copy_bytes(new_ptr, orig_ptr, fr_alloc.first);
        orig_ptr += fr_alloc.first;
        new_ptr += fr_alloc.first;

        // Set new allocation
        new_ptr += vbyte::encode(new_ptr, len + sizeof(value_type));
        copy_bytes(new_ptr, key.begin, len);
        new_ptr += len;
        *reinterpret_cast<value_type*>(new_ptr) = static_cast<value_type>(0);

        // Copy the back allocation
        copy_bytes(new_ptr + sizeof(value_type), orig_ptr, fr_alloc.second);

        // Overwrite
        ptrs_[chunk_id] = std::move(new_unique);

        return reinterpret_cast<value_type*>(new_ptr);
    }